

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O3

void Eso_ManCoverPrint(Eso_Man_t *p,Vec_Int_t *vEsop)

{
  int *piVar1;
  size_t __size;
  int iVar2;
  Hsh_VecMan_t *pHVar3;
  uint *__ptr;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint *puVar9;
  size_t sVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  
  if (vEsop->nSize == 0) {
    puts("Const 0");
    return;
  }
  uVar8 = p->nVars;
  uVar11 = (ulong)uVar8;
  sVar10 = (size_t)(int)uVar8;
  __ptr = (uint *)malloc(0x10);
  uVar12 = 0x10;
  if (0xe < uVar8 + 3) {
    uVar12 = uVar8 + 4;
  }
  __ptr[1] = 0;
  *__ptr = uVar12;
  if (uVar12 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    uVar5 = uVar11;
    if ((int)uVar8 < 1) {
      uVar12 = 0;
      goto LAB_00738c40;
    }
LAB_00738c1a:
    pvVar4 = malloc(uVar5);
LAB_00738c1f:
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = uVar8;
    uVar12 = uVar8;
  }
  else {
    pvVar4 = malloc((long)(int)uVar12);
    *(void **)(__ptr + 2) = pvVar4;
    if ((int)uVar12 < (int)uVar8) {
      uVar5 = sVar10;
      if (pvVar4 == (void *)0x0) goto LAB_00738c1a;
      pvVar4 = realloc(pvVar4,sVar10);
      goto LAB_00738c1f;
    }
  }
  if (0 < (int)uVar8) {
    uVar5 = 0;
    do {
      *(undefined1 *)(*(long *)(__ptr + 2) + uVar5) = 0x2d;
      uVar5 = uVar5 + 1;
    } while (uVar11 != uVar5);
  }
LAB_00738c40:
  puVar9 = __ptr + 2;
  if (uVar8 == uVar12) {
    if ((int)uVar8 < 0x10) {
      if (*(void **)puVar9 == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)puVar9,0x10);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = 0x10;
    }
    else {
      __size = uVar11 * 2;
      if (*(void **)puVar9 == (void *)0x0) {
        pvVar4 = malloc(__size);
      }
      else {
        pvVar4 = realloc(*(void **)puVar9,__size);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = (uint)__size;
    }
  }
  else {
    pvVar4 = *(void **)puVar9;
  }
  __ptr[1] = uVar8 + 1;
  *(undefined1 *)((long)pvVar4 + sVar10) = 0x20;
  uVar8 = __ptr[1];
  if (uVar8 == *__ptr) {
    if ((int)uVar8 < 0x10) {
      if (*(void **)puVar9 == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)puVar9,0x10);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = 0x10;
    }
    else {
      sVar10 = (ulong)uVar8 * 2;
      if (*(void **)puVar9 == (void *)0x0) {
        pvVar4 = malloc(sVar10);
      }
      else {
        pvVar4 = realloc(*(void **)puVar9,sVar10);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = (uint)sVar10;
    }
  }
  else {
    pvVar4 = *(void **)puVar9;
  }
  __ptr[1] = uVar8 + 1;
  *(undefined1 *)((long)pvVar4 + (long)(int)uVar8) = 0x31;
  uVar8 = __ptr[1];
  if (uVar8 == *__ptr) {
    if ((int)uVar8 < 0x10) {
      if (*(void **)puVar9 == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)puVar9,0x10);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = 0x10;
    }
    else {
      sVar10 = (ulong)uVar8 * 2;
      if (*(void **)puVar9 == (void *)0x0) {
        pvVar4 = malloc(sVar10);
      }
      else {
        pvVar4 = realloc(*(void **)puVar9,sVar10);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = (uint)sVar10;
    }
  }
  else {
    pvVar4 = *(void **)puVar9;
  }
  __ptr[1] = uVar8 + 1;
  *(undefined1 *)((long)pvVar4 + (long)(int)uVar8) = 10;
  uVar8 = __ptr[1];
  if (uVar8 == *__ptr) {
    if ((int)uVar8 < 0x10) {
      if (*(void **)puVar9 == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)puVar9,0x10);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = 0x10;
    }
    else {
      sVar10 = (ulong)uVar8 * 2;
      if (*(void **)puVar9 == (void *)0x0) {
        pvVar4 = malloc(sVar10);
      }
      else {
        pvVar4 = realloc(*(void **)puVar9,sVar10);
      }
      *(void **)(__ptr + 2) = pvVar4;
      *__ptr = (uint)sVar10;
    }
  }
  else {
    pvVar4 = *(void **)puVar9;
  }
  __ptr[1] = uVar8 + 1;
  *(undefined1 *)((long)pvVar4 + (long)(int)uVar8) = 0;
  if (vEsop->nSize < 1) {
    __assert_fail("Vec_IntSize(vEsop) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEsop.c"
                  ,0x80,"void Eso_ManCoverPrint(Eso_Man_t *, Vec_Int_t *)");
  }
  lVar13 = 0;
  do {
    uVar8 = vEsop->pArray[lVar13];
    if (uVar8 == p->Cube1) {
      printf("%s",*(undefined8 *)puVar9);
    }
    else {
      if ((int)uVar8 < 0) {
        __assert_fail("iCube >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEsop.c"
                      ,0x30,"Vec_Int_t *Eso_ManCube(Eso_Man_t *, int)");
      }
      pHVar3 = p->pHash;
      if (pHVar3->vMap->nSize <= (int)uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pHVar3->vMap->pArray[uVar8];
      if (((long)iVar2 < 0) || (pHVar3->vData->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar1 = pHVar3->vData->pArray + iVar2;
      iVar2 = *piVar1;
      (pHVar3->vTemp).nCap = iVar2;
      (pHVar3->vTemp).nSize = iVar2;
      (pHVar3->vTemp).pArray = piVar1 + 2;
      if (0 < iVar2) {
        lVar6 = 0;
        do {
          uVar8 = (pHVar3->vTemp).pArray[lVar6];
          if ((int)uVar8 < 0) goto LAB_00738f73;
          if ((int)__ptr[1] <= (int)(uVar8 >> 1)) goto LAB_00738f92;
          *(byte *)(*(long *)puVar9 + (ulong)(uVar8 >> 1)) = (byte)uVar8 & 1 ^ 0x31;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pHVar3->vTemp).nSize);
      }
      lVar6 = *(long *)puVar9;
      printf("%s",lVar6);
      if (0 < (pHVar3->vTemp).nSize) {
        lVar7 = 0;
        do {
          uVar8 = (pHVar3->vTemp).pArray[lVar7];
          if ((int)uVar8 < 0) {
LAB_00738f73:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar8 = uVar8 >> 1;
          if ((int)__ptr[1] <= (int)uVar8) {
LAB_00738f92:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
          }
          *(undefined1 *)(lVar6 + (ulong)uVar8) = 0x2d;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pHVar3->vTemp).nSize);
      }
    }
    lVar13 = lVar13 + 1;
    if (vEsop->nSize <= lVar13) {
      putchar(10);
      if (*(void **)puVar9 != (void *)0x0) {
        free(*(void **)puVar9);
      }
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void Eso_ManCoverPrint( Eso_Man_t * p, Vec_Int_t * vEsop )
{
    Vec_Str_t * vStr;
    Vec_Int_t * vCube;
    int i, k, Lit, Cube;
    if ( Vec_IntSize(vEsop) == 0 )
    {
        printf( "Const 0\n" );
        return;
    }
    vStr = Vec_StrAlloc( p->nVars + 4 );
    Vec_StrFill( vStr, p->nVars, '-' );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '1' );
    Vec_StrPush( vStr, '\n' );
    Vec_StrPush( vStr, '\0' );
    assert( Vec_IntSize(vEsop) > 0 );
    Vec_IntForEachEntry( vEsop, Cube, i )
    {
        if ( Cube == p->Cube1 )
            printf( "%s", Vec_StrArray(vStr) );
        else 
        {
            vCube = Eso_ManCube( p, Cube );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit)?'0':'1') );
            printf( "%s", Vec_StrArray(vStr) );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), '-' );
        }
    }
    printf( "\n" );
    Vec_StrFree( vStr );
}